

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTableBreakingLogic.cpp
# Opt level: O2

QVector<int> * __thiscall
KDReports::TableBreakingLogic::columnsPerPage
          (QVector<int> *__return_storage_ptr__,TableBreakingLogic *this)

{
  uint uVar1;
  bool bVar2;
  const_reference pdVar3;
  reference piVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong i;
  double local_70;
  double local_68;
  double local_58;
  
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  if (this->m_pages != 0) {
    uVar1 = (uint)(this->m_widths).d.size;
    i = 0;
    uVar6 = 0;
    if (0 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    local_70 = 0.0;
    for (; uVar6 != i; i = i + 1) {
      pdVar3 = QList<double>::at(&this->m_widths,i);
      local_70 = local_70 + *pdVar3;
    }
    iVar5 = this->m_pages;
    QList<int>::resize(__return_storage_ptr__,(long)iVar5);
    local_70 = local_70 / (double)iVar5;
    iVar8 = 0;
    local_68 = 0.0;
    iVar7 = 0;
    for (iVar5 = 0; iVar5 < (int)uVar1; iVar5 = iVar5 + 1) {
      pdVar3 = QList<double>::at(&this->m_widths,(long)iVar5);
      local_58 = *pdVar3 + local_68;
      if ((local_58 <= local_70) || (iVar7 == this->m_pages + -1)) {
        iVar8 = iVar8 + 1;
      }
      else {
        piVar4 = QList<int>::operator[](__return_storage_ptr__,(long)iVar7);
        bVar2 = local_68 == 0.0 || local_58 < (local_70 * 4.0) / 3.0;
        iVar5 = iVar5 - ((byte)~-bVar2 & 1);
        iVar7 = iVar7 + 1;
        *piVar4 = iVar8 + (uint)bVar2;
        iVar8 = 0;
        local_58 = 0.0;
      }
      local_68 = local_58;
    }
    if (iVar7 < this->m_pages && 0 < iVar8) {
      piVar4 = QList<int>::operator[](__return_storage_ptr__,(long)iVar7);
      iVar7 = iVar7 + 1;
      *piVar4 = iVar8;
    }
    QList<int>::resize(__return_storage_ptr__,(long)iVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

QVector<int> TableBreakingLogic::columnsPerPage() const
{
    QVector<int> columnsForPage;
    if (m_pages == 0)
        return columnsForPage;
    const int numColumnsForPage = m_widths.count();
    qreal totalWidth = 0;
    for (int i = 0; i < numColumnsForPage; ++i) {
        totalWidth += m_widths[i];
    }
    const qreal idealPageWidth = totalWidth / m_pages;
    // qDebug() << "idealPageWidth=" << idealPageWidth;
    qreal currentWidth = 0;
    columnsForPage.resize(m_pages);
    int columnsInThisPage = 0;
    int pageNumber = 0;
    for (int i = 0; i < numColumnsForPage; ++i) {
        const qreal columnWidth = m_widths[i];
        const bool lastPage = pageNumber == m_pages - 1;
        if (currentWidth + columnWidth > idealPageWidth && !lastPage) {
            // Better to include or exclude the column?
            // That's the tricky part. If we exclude too much
            // the last page will be crammed, while if we include
            // a huge column this one might be crammed.
            // Let's have a threshold then: include it if we won't go over-board
            // more than 1/3rd of the page width.
            if (currentWidth + columnWidth < idealPageWidth * 4 / 3 || currentWidth == 0) { // Avoid infinite loop if huge column
                columnsInThisPage += 1;
            } else {
                // current column will be for next page.
                --i;
            }
            columnsForPage[pageNumber++] = columnsInThisPage;

            currentWidth = 0;
            columnsInThisPage = 0;
        } else {
            currentWidth += columnWidth;
            columnsInThisPage += 1;
        }
    }
    if (pageNumber < m_pages && columnsInThisPage > 0) {
        columnsForPage[pageNumber++] = columnsInThisPage;
    }
    columnsForPage.resize(pageNumber);
#ifdef DEBUG_TABLEBREAKINGLOGIC
    qDebug() << "Result of optimized table breaking:" << columnsForPage;
#endif
    return columnsForPage;
}